

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ScratchFree(void *p)

{
  int iVar1;
  _func_void_sqlite3_mutex_ptr **pp_Var2;
  ScratchFreeslot *pSlot;
  
  if (p != (void *)0x0) {
    if ((p < sqlite3Config.pScratch) || (mem0.pScratchEnd <= p)) {
      if (sqlite3Config.bMemstat == 0) {
        pp_Var2 = (_func_void_sqlite3_mutex_ptr **)&sqlite3Config.m.xFree;
        goto LAB_001291bf;
      }
      iVar1 = (*sqlite3Config.m.xSize)(p);
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      }
      sqlite3Stat.nowValue[4] = sqlite3Stat.nowValue[4] - iVar1;
      if (sqlite3Stat.mxValue[4] < sqlite3Stat.nowValue[4]) {
        sqlite3Stat.mxValue[4] = sqlite3Stat.nowValue[4];
      }
      sqlite3Stat.nowValue[0] = sqlite3Stat.nowValue[0] - iVar1;
      if (sqlite3Stat.mxValue[0] < sqlite3Stat.nowValue[0]) {
        sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
      }
      sqlite3Stat.nowValue[9] = sqlite3Stat.nowValue[9] + -1;
      if (sqlite3Stat.mxValue[9] < sqlite3Stat.nowValue[9]) {
        sqlite3Stat.mxValue[9] = sqlite3Stat.nowValue[9];
      }
      (*sqlite3Config.m.xFree)(p);
    }
    else {
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      }
      *(ScratchFreeslot **)p = mem0.pScratchFree;
      mem0.nScratchFree = mem0.nScratchFree + 1;
      sqlite3Stat.nowValue[3] = sqlite3Stat.nowValue[3] + -1;
      mem0.pScratchFree = (ScratchFreeslot *)p;
      if (sqlite3Stat.mxValue[3] < sqlite3Stat.nowValue[3]) {
        sqlite3Stat.mxValue[3] = sqlite3Stat.nowValue[3];
      }
    }
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      pp_Var2 = &sqlite3Config.mutex.xMutexLeave;
      p = mem0.mutex;
LAB_001291bf:
      (**pp_Var2)((sqlite3_mutex *)p);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ScratchFree(void *p){
  if( p ){

#if SQLITE_THREADSAFE==0 && !defined(NDEBUG)
    /* Verify that no more than two scratch allocation per thread
    ** is outstanding at one time.  (This is only checked in the
    ** single-threaded case since checking in the multi-threaded case
    ** would be much more complicated.) */
    assert( scratchAllocOut>=1 && scratchAllocOut<=2 );
    scratchAllocOut--;
#endif

    if( p>=sqlite3GlobalConfig.pScratch && p<mem0.pScratchEnd ){
      /* Release memory from the SQLITE_CONFIG_SCRATCH allocation */
      ScratchFreeslot *pSlot;
      pSlot = (ScratchFreeslot*)p;
      sqlite3_mutex_enter(mem0.mutex);
      pSlot->pNext = mem0.pScratchFree;
      mem0.pScratchFree = pSlot;
      mem0.nScratchFree++;
      assert( mem0.nScratchFree <= (u32)sqlite3GlobalConfig.nScratch );
      sqlite3StatusAdd(SQLITE_STATUS_SCRATCH_USED, -1);
      sqlite3_mutex_leave(mem0.mutex);
    }else{
      /* Release memory back to the heap */
      assert( sqlite3MemdebugHasType(p, MEMTYPE_SCRATCH) );
      assert( sqlite3MemdebugNoType(p, ~MEMTYPE_SCRATCH) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      if( sqlite3GlobalConfig.bMemstat ){
        int iSize = sqlite3MallocSize(p);
        sqlite3_mutex_enter(mem0.mutex);
        sqlite3StatusAdd(SQLITE_STATUS_SCRATCH_OVERFLOW, -iSize);
        sqlite3StatusAdd(SQLITE_STATUS_MEMORY_USED, -iSize);
        sqlite3StatusAdd(SQLITE_STATUS_MALLOC_COUNT, -1);
        sqlite3GlobalConfig.m.xFree(p);
        sqlite3_mutex_leave(mem0.mutex);
      }else{
        sqlite3GlobalConfig.m.xFree(p);
      }
    }
  }
}